

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3443::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3443 *this,double xi,
          double eta,double zeta)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ActualDstType actualDst;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  ChMatrix33<double> I3x3;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  Scalar local_508 [9];
  Matrix<double,_3,_3,_0,_3,_3> local_4c0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  local_440 [16];
  undefined8 local_430;
  Matrix<double,_3,_3,_0,_3,_3> *local_428;
  Matrix<double,_3,_3,_0,_3,_3> *local_420;
  Scalar *local_418;
  Matrix<double,_3,_3,_1,_3,_3> local_400;
  undefined1 local_380 [16];
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  MatrixNx3c *local_330;
  Matrix<double,_3,_3,_1,_3,_3> *local_328;
  double local_320;
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  Calc_Sxi_D(this,(MatrixNx3c *)local_200,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
  local_380._0_8_ = 1.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            (&local_400,&this->m_ebar0,(MatrixNx3c *)local_200,(Scalar *)local_380);
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_200;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_400;
  local_380._0_8_ = (MatrixNx3c *)local_200;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_380 + 8),
        (SrcXprType *)
        (local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array + 1),(assign_op<double,_double> *)local_508);
  local_330 = (MatrixNx3c *)local_380._0_8_;
  local_320 = 1.48219693752374e-323;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_380._8_8_;
  auVar14 = vbroadcastsd_avx512f(auVar5);
  auVar23 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array;
  auVar24 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
              m_storage).m_data.array + 8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_360;
  auVar15 = vbroadcastsd_avx512f(auVar6);
  auVar1 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x10);
  auVar2 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_370;
  auVar16 = vbroadcastsd_avx512f(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_348;
  auVar17 = vbroadcastsd_avx512f(auVar8);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_16,_3,_0,_16,_3>_> *)local_380._0_8_)->
             m_storage).m_data.array + 0x28);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_358;
  auVar18 = vbroadcastsd_avx512f(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_350;
  auVar19 = vbroadcastsd_avx512f(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_340;
  auVar20 = vbroadcastsd_avx512f(auVar11);
  auVar21 = vmulpd_avx512f(auVar23,auVar14);
  auVar14 = vmulpd_avx512f(auVar14,auVar24);
  auVar22 = vmulpd_avx512f(auVar23,auVar16);
  auVar21 = vfmadd231pd_avx512f(auVar21,auVar1,auVar15);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar2,auVar15);
  auVar15 = vfmadd231pd_avx512f(auVar22,auVar1,auVar18);
  local_200 = vfmadd231pd_avx512f(auVar21,auVar3,auVar17);
  local_1c0 = vfmadd231pd_avx512f(auVar14,auVar4,auVar17);
  auVar14 = vmulpd_avx512f(auVar24,auVar16);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_338;
  auVar16 = vbroadcastsd_avx512f(auVar12);
  local_180 = vfmadd231pd_avx512f(auVar15,auVar3,auVar20);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar2,auVar18);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_368;
  auVar15 = vbroadcastsd_avx512f(auVar13);
  local_140 = vfmadd231pd_avx512f(auVar14,auVar4,auVar20);
  auVar23 = vmulpd_avx512f(auVar23,auVar15);
  auVar24 = vmulpd_avx512f(auVar24,auVar15);
  auVar23 = vfmadd231pd_avx512f(auVar23,auVar19,auVar1);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar2,auVar19);
  local_100 = vfmadd231pd_avx512f(auVar23,auVar16,auVar3);
  local_c0 = vfmadd231pd_avx512f(auVar24,auVar4,auVar16);
  local_328 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_380 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_380);
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_508[0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,3,0,16,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_4c0,(Matrix3xN *)local_380,(MatrixNx3c *)local_200,local_508);
  local_508[0] = 1.0;
  local_508[3] = 0.0;
  local_508[1] = 0.0;
  local_508[2] = 0.0;
  local_508[4] = 1.0;
  local_508[7] = 0.0;
  local_508[5] = 0.0;
  local_508[6] = 0.0;
  local_508[8] = 1.0;
  local_430 = 0x3fe0000000000000;
  local_428 = &local_4c0;
  local_420 = &local_4c0;
  local_418 = local_508;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (__return_storage_ptr__,local_440);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3443::GetGreenLagrangeStrain(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}